

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::decode
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,JsonCodec *this,
          ArrayPtr<const_char> input,Type type,Orphanage orphanage)

{
  StructDataBitCount *this_00;
  Builder output;
  Reader input_00;
  Reader local_1d8;
  SegmentBuilder *local_1a8;
  SegmentBuilder *pSStack_1a0;
  CapTableBuilder *local_198;
  void *pvStack_190;
  WirePointer *local_188;
  char *local_178;
  size_t sStack_170;
  undefined1 auStack_150 [8];
  Builder json;
  MallocMessageBuilder message;
  JsonCodec *this_local;
  Type type_local;
  ArrayPtr<const_char> input_local;
  
  this_00 = &json._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::json::Value>((Builder *)auStack_150,(MessageBuilder *)this_00);
  local_188 = json._builder.pointers;
  local_198 = json._builder.capTable;
  pvStack_190 = json._builder.data;
  local_1a8 = (SegmentBuilder *)auStack_150;
  pSStack_1a0 = json._builder.segment;
  output._builder.capTable = (CapTableBuilder *)json._builder.segment;
  output._builder.segment = (SegmentBuilder *)auStack_150;
  output._builder.data = json._builder.capTable;
  output._builder.pointers = (WirePointer *)json._builder.data;
  output._builder._32_8_ = json._builder.pointers;
  local_178 = input.ptr;
  sStack_170 = input.size_;
  decodeRaw(this,input,output);
  capnp::json::Value::Builder::operator_cast_to_Reader(&local_1d8,(Builder *)auStack_150);
  input_00._reader.capTable = local_1d8._reader.capTable;
  input_00._reader.segment = local_1d8._reader.segment;
  input_00._reader.data = local_1d8._reader.data;
  input_00._reader.pointers = local_1d8._reader.pointers;
  input_00._reader.dataSize = local_1d8._reader.dataSize;
  input_00._reader.pointerCount = local_1d8._reader.pointerCount;
  input_00._reader._38_2_ = local_1d8._reader._38_2_;
  input_00._reader.nestingLimit = local_1d8._reader.nestingLimit;
  input_00._reader._44_4_ = local_1d8._reader._44_4_;
  decode(__return_storage_ptr__,this,input_00,type,orphanage);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&json._builder.dataSize);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> JsonCodec::decode(
    kj::ArrayPtr<const char> input, Type type, Orphanage orphanage) const {
  MallocMessageBuilder message;
  auto json = message.getRoot<JsonValue>();
  decodeRaw(input, json);
  return decode(json, type, orphanage);
}